

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::_abi_1_10::ZoneAllocator::reset(ZoneAllocator *this,Zone *zone)

{
  DynamicBlock *pDVar1;
  DynamicBlock *__ptr;
  
  __ptr = this->_dynamicBlocks;
  while (__ptr != (DynamicBlock *)0x0) {
    pDVar1 = __ptr->next;
    free(__ptr);
    __ptr = pDVar1;
  }
  this->_slots[8] = (Slot *)0x0;
  this->_slots[9] = (Slot *)0x0;
  this->_slots[6] = (Slot *)0x0;
  this->_slots[7] = (Slot *)0x0;
  this->_slots[4] = (Slot *)0x0;
  this->_slots[5] = (Slot *)0x0;
  this->_slots[2] = (Slot *)0x0;
  this->_slots[3] = (Slot *)0x0;
  this->_slots[0] = (Slot *)0x0;
  this->_slots[1] = (Slot *)0x0;
  this->_dynamicBlocks = (DynamicBlock *)0x0;
  this->_zone = zone;
  return;
}

Assistant:

void ZoneAllocator::reset(Zone* zone) noexcept {
  // Free dynamic blocks.
  DynamicBlock* block = _dynamicBlocks;
  while (block) {
    DynamicBlock* next = block->next;
    ::free(block);
    block = next;
  }

  // Zero the entire class and initialize to the given `zone`.
  memset(this, 0, sizeof(*this));
  _zone = zone;
}